

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_qdxt5.cpp
# Opt level: O0

void __thiscall crnlib::qdxt5::qdxt5(qdxt5 *this,task_pool *task_pool)

{
  vector<crnlib::vector<unsigned_int>_> *local_50;
  task_pool *task_pool_local;
  qdxt5 *this_local;
  
  this->m_pTask_pool = task_pool;
  this->m_main_thread_id = 0;
  this->m_canceled = false;
  this->m_progress_start = 0;
  this->m_progress_range = 100;
  this->m_num_blocks = 0;
  this->m_pBlocks = (dxt_pixel_block *)0x0;
  this->m_pDst_elements = (dxt5_block *)0x0;
  this->m_elements_per_block = 0;
  qdxt5_params::qdxt5_params(&this->m_params);
  this->m_max_selector_clusters = 0;
  this->m_prev_percentage_complete = -1;
  clusterizer<crnlib::vec<2U,_float>_>::clusterizer(&this->m_endpoint_clusterizer);
  vector<crnlib::vector<unsigned_int>_>::vector(&this->m_endpoint_cluster_indices);
  threaded_clusterizer<crnlib::vec<16U,_float>_>::threaded_clusterizer
            (&this->m_selector_clusterizer,task_pool);
  local_50 = this->m_cached_selector_cluster_indices;
  do {
    vector<crnlib::vector<unsigned_int>_>::vector(local_50);
    local_50 = local_50 + 1;
  } while ((cluster_hash *)local_50 != &this->m_cluster_hash);
  hash_map<crnlib::qdxt5::cluster_id,_unsigned_int,_crnlib::hasher<crnlib::qdxt5::cluster_id>,_crnlib::equal_to<crnlib::qdxt5::cluster_id>_>
  ::hash_map(&this->m_cluster_hash);
  spinlock::spinlock(&this->m_cluster_hash_lock);
  return;
}

Assistant:

qdxt5::qdxt5(task_pool& task_pool) :
        m_pTask_pool(&task_pool),
        m_main_thread_id(0),
        m_canceled(false),
        m_progress_start(0),
        m_progress_range(100),
        m_num_blocks(0),
        m_pBlocks(nullptr),
        m_pDst_elements(nullptr),
        m_elements_per_block(0),
        m_max_selector_clusters(0),
        m_prev_percentage_complete(-1),
        m_selector_clusterizer(task_pool)
    {
    }